

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *
__thiscall
libtorrent::aux::torrent::trackers
          (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           *__return_storage_ptr__,torrent *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ushort uVar4;
  undefined8 uVar5;
  long lVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  string *psVar11;
  announce_endpoint *ep;
  node_ptr plVar12;
  node_ptr plVar13;
  long lVar14;
  node_ptr plVar15;
  byte local_6a [2];
  vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
  *local_68;
  node_ptr local_60;
  node_ptr local_58;
  node_ptr local_50;
  long local_48;
  vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
  *local_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::reserve(__return_storage_ptr__,
            (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.super_size_traits.size_);
  plVar12 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_
  ;
  plVar15 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node;
  local_68 = (vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
              *)__return_storage_ptr__;
  local_58 = plVar15;
  if (plVar12 != plVar15) {
    do {
      ::std::
      vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar12 + 1))
      ;
      lVar1 = *(long *)((long)__return_storage_ptr__ + 8);
      *(byte *)(lVar1 + -6) =
           *(byte *)(lVar1 + -6) & 0xf0 | *(byte *)((long)&plVar12[6].prev_ + 6) & 0xf;
      ::std::__cxx11::string::_M_assign((string *)(lVar1 + -0x40));
      *(byte *)(lVar1 + -6) =
           *(byte *)(lVar1 + -6) & 0xef | *(byte *)((long)&plVar12[6].prev_ + 6) & 0x10;
      *(undefined1 *)(lVar1 + -8) = *(undefined1 *)((long)&plVar12[6].prev_ + 4);
      *(undefined1 *)(lVar1 + -7) = *(undefined1 *)((long)&plVar12[6].prev_ + 5);
      local_40 = (vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
                  *)(lVar1 + -0x20);
      ::std::
      vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
      ::reserve(local_40,((long)plVar12[5].prev_ - (long)plVar12[5].next_ >> 3) *
                         -0x70a3d70a3d70a3d7);
      plVar13 = plVar12[5].next_;
      local_50 = plVar12[5].prev_;
      local_60 = plVar12;
      local_48 = lVar1;
      if (plVar13 != local_50) {
        do {
          lVar1 = local_48;
          ::std::
          vector<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
          ::emplace_back<>(local_40);
          local_38 = *(long *)(lVar1 + -0x18);
          plVar12 = plVar13->next_;
          plVar15 = plVar13->prev_;
          uVar5 = *(undefined8 *)((long)&plVar13[1].next_ + 4);
          *(undefined8 *)(local_38 + -0xec) = *(undefined8 *)((long)&plVar13->prev_ + 4);
          *(undefined8 *)(local_38 + -0xe4) = uVar5;
          *(node_ptr *)(local_38 + -0xf8) = plVar12;
          *(node_ptr *)(local_38 + -0xf0) = plVar15;
          *(byte *)(local_38 + -2) = *(byte *)&plVar13[0xb].next_ & 1;
          local_6a[0] = 0;
          local_6a[1] = 1;
          lVar1 = local_38 + -0xd8;
          lVar14 = 0;
          do {
            uVar2 = (ulong)local_6a[lVar14];
            lVar3 = uVar2 * 0x48;
            psVar11 = (string *)(lVar3 + lVar1);
            ::std::__cxx11::string::_M_assign(psVar11);
            lVar6 = local_38;
            uVar5 = *(undefined8 *)((long)plVar13 + (uVar2 * 9 + 9) * 8);
            *(undefined8 *)(psVar11 + 0x20) = *(undefined8 *)((long)plVar13 + (uVar2 * 9 + 8) * 8);
            *(undefined8 *)(psVar11 + 0x28) = uVar5;
            *(undefined4 *)(psVar11 + 0x30) = *(undefined4 *)((long)plVar13 + (uVar2 * 9 + 10) * 8);
            *(undefined4 *)(psVar11 + 0x34) = *(undefined4 *)((long)plVar13 + lVar3 + 0x54);
            *(undefined4 *)(psVar11 + 0x38) = *(undefined4 *)((long)plVar13 + (uVar2 * 9 + 0xb) * 8)
            ;
            *(undefined4 *)(psVar11 + 0x3c) = *(undefined4 *)((long)plVar13 + lVar3 + 0x5c);
            *(undefined4 *)(psVar11 + 0x40) = *(undefined4 *)((long)plVar13 + (uVar2 * 9 + 0xc) * 8)
            ;
            uVar8 = *(ushort *)((long)plVar13 + lVar3 + 100) & 0x7f;
            uVar4 = (ushort)*(undefined4 *)(psVar11 + 0x44);
            *(ushort *)(psVar11 + 0x44) = uVar4 & 0xff80 | uVar8;
            uVar7 = *(ushort *)((long)plVar13 + lVar3 + 100) & 0x80;
            *(ushort *)(psVar11 + 0x44) = uVar4 & 0xff00 | uVar8 | uVar7;
            uVar9 = *(ushort *)((long)plVar13 + lVar3 + 100) & 0x100;
            *(ushort *)(psVar11 + 0x44) = uVar4 & 0xfe00 | uVar8 | uVar7 | uVar9;
            uVar10 = *(ushort *)((long)plVar13 + lVar3 + 100) & 0x200;
            *(ushort *)(psVar11 + 0x44) = uVar4 & 0xfc00 | uVar8 | uVar7 | uVar9 | uVar10;
            *(ushort *)(psVar11 + 0x44) =
                 uVar4 & 0xf800 | uVar8 | uVar7 | uVar9 | uVar10 |
                 *(ushort *)((long)plVar13 + lVar3 + 100) & 0x400;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 2);
          ::std::__cxx11::string::_M_assign((string *)(local_38 + -0x40));
          *(undefined4 *)(lVar6 + -0x10) = *(undefined4 *)&plVar13[5].prev_;
          *(undefined4 *)(lVar6 + -0xc) = *(undefined4 *)((long)&plVar13[5].prev_ + 4);
          *(undefined4 *)(lVar6 + -8) = *(undefined4 *)&plVar13[6].next_;
          uVar8 = *(ushort *)((long)&plVar13[6].next_ + 4) & 0x200;
          uVar4 = (ushort)*(undefined4 *)(lVar6 + -4);
          *(ushort *)(lVar6 + -4) = uVar4 & 0xfdff | uVar8;
          plVar12 = plVar13[4].prev_;
          *(node_ptr *)(lVar6 + -0x20) = plVar13[4].next_;
          *(node_ptr *)(lVar6 + -0x18) = plVar12;
          uVar7 = *(ushort *)((long)&plVar13[6].next_ + 4) & 0x7f;
          *(ushort *)(lVar6 + -4) = uVar4 & 0xfd80 | uVar8 | uVar7;
          *(undefined4 *)(lVar6 + -0x48) = *(undefined4 *)&plVar13[5].next_;
          *(undefined4 *)(lVar6 + -0x44) = *(undefined4 *)((long)&plVar13[5].next_ + 4);
          *(ushort *)(lVar6 + -4) =
               uVar4 & 0xfd00 | uVar8 | uVar7 | *(ushort *)((long)&plVar13[6].next_ + 4) & 0x80;
          plVar13 = (node_ptr)&plVar13[0xc].prev_;
          __return_storage_ptr__ =
               (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                *)local_68;
          plVar15 = local_58;
        } while (plVar13 != local_50);
      }
      plVar12 = local_60->next_;
    } while (plVar12 != plVar15);
  }
  return (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *)(vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<lt::announce_entry> torrent::trackers() const
	{
		std::vector<lt::announce_entry> ret;
		ret.reserve(m_trackers.size());
		for (auto const& t : m_trackers)
		{
			ret.emplace_back(t.url);
			auto& tr = ret.back();
			tr.source = t.source;
			tr.trackerid = t.trackerid;
			tr.verified = t.verified;
			tr.tier = t.tier;
			tr.fail_limit = t.fail_limit;
			tr.endpoints.reserve(t.endpoints.size());
			for (auto const& ep : t.endpoints)
			{
				tr.endpoints.emplace_back();
				auto& aep = tr.endpoints.back();
				aep.local_endpoint = ep.local_endpoint;
				aep.enabled = ep.enabled;

				for (protocol_version v : {protocol_version::V1, protocol_version::V2})
				{
					aep.info_hashes[v].message = ep.info_hashes[v].message;
					aep.info_hashes[v].last_error = ep.info_hashes[v].last_error;
					aep.info_hashes[v].next_announce = ep.info_hashes[v].next_announce;
					aep.info_hashes[v].min_announce = ep.info_hashes[v].min_announce;
					aep.info_hashes[v].scrape_incomplete = ep.info_hashes[v].scrape_incomplete;
					aep.info_hashes[v].scrape_complete = ep.info_hashes[v].scrape_complete;
					aep.info_hashes[v].scrape_downloaded = ep.info_hashes[v].scrape_downloaded;
					aep.info_hashes[v].fails = ep.info_hashes[v].fails;
					aep.info_hashes[v].updating = ep.info_hashes[v].updating;
					aep.info_hashes[v].start_sent = ep.info_hashes[v].start_sent;
					aep.info_hashes[v].complete_sent = ep.info_hashes[v].complete_sent;
					aep.info_hashes[v].triggered_manually = ep.info_hashes[v].triggered_manually;
#if TORRENT_ABI_VERSION == 1
					tr.complete_sent |= ep.info_hashes[v].complete_sent;
#endif
				}
#if TORRENT_ABI_VERSION <= 2
#include "libtorrent/aux_/disable_warnings_push.hpp"
				aep.message = aep.info_hashes[protocol_version::V1].message;
				aep.scrape_incomplete = ep.info_hashes[protocol_version::V1].scrape_incomplete;
				aep.scrape_complete = ep.info_hashes[protocol_version::V1].scrape_complete;
				aep.scrape_downloaded = ep.info_hashes[protocol_version::V1].scrape_downloaded;
				aep.complete_sent = ep.info_hashes[protocol_version::V1].complete_sent;
				aep.last_error = ep.info_hashes[protocol_version::V1].last_error;
				aep.fails = ep.info_hashes[protocol_version::V1].fails;
				aep.next_announce = ep.info_hashes[protocol_version::V1].next_announce;
				aep.min_announce = ep.info_hashes[protocol_version::V1].min_announce;
				aep.updating = ep.info_hashes[protocol_version::V1].updating;
#include "libtorrent/aux_/disable_warnings_pop.hpp"
#endif
			}
		}
		return ret;
	}